

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_parser.h
# Opt level: O2

void __thiscall CMakeParser::SetDebugMode(CMakeParser *this,DebugMode mode)

{
  bool enable;
  
  switch(mode) {
  case Disabled:
    yy::parser::set_debug_level(&this->parser,0);
    enable = false;
    break;
  case Parser:
    yy::parser::set_debug_level(&this->parser,1);
    return;
  case Scanner:
    enable = true;
    break;
  case Full:
    yy::parser::set_debug_level(&this->parser,1);
    enable = true;
    break;
  default:
    return;
  }
  CMakeScanner::SetDebug(&this->scanner,enable);
  return;
}

Assistant:

void SetDebugMode(const DebugMode mode)
    {
        switch(mode)
        {
        case DebugMode::Disabled:
            parser.set_debug_level(0);
            scanner.SetDebug(false);
            break;
        case DebugMode::Parser:
            parser.set_debug_level(1);
            break;
        case DebugMode::Scanner:
            scanner.SetDebug(true);
            break;
        case DebugMode::Full:
            parser.set_debug_level(1);
            scanner.SetDebug(true);
            break;
        default:
            break;
        }
    }